

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gp3p::sPolynomial47
               (Matrix<double,_48,_85,_0,_48,_85> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Scalar *pSVar5;
  DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1> *this;
  Index in_stack_fffffffffffffeb8;
  Scalar row;
  DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1> *in_stack_fffffffffffffec0;
  
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,0x8cf986);
  row = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (in_stack_fffffffffffffec0,(Index)row,0x8cf9a6);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1> *)(row / *pSVar5);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cf9cc);
  *pSVar5 = (Scalar)this;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cf9ed);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfa25);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfa4c);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfa6d);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfaa5);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfacc);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfaed);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfb25);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfb4c);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfb6d);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfb8e);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfbb5);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfbd6);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfbf7);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfc1e);
  dVar3 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfc3f);
  dVar4 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfc70);
  *pSVar5 = dVar1 / dVar2 - dVar3 / dVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfc91);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfcc9);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfcf0);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfd11);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfd4c);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfd79);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfd9d);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfdc1);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfdee);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfe12);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfe4d);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfe7a);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfe9e);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfec2);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cfeef);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cff13);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cff37);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cff64);
  dVar3 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cff88);
  dVar4 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cffc2);
  *pSVar5 = dVar1 / dVar2 - dVar3 / dVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8cffe6);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8d0021);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8d004e);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8d0072);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8d00ad);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8d00da);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8d00fe);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8d0122);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8d014f);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8d0173);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8d01ae);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8d01db);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8d01ff);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8d0223);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8d0250);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8d0274);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8d02af);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8d02dc);
  *pSVar5 = -dVar1 / dVar2;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gp3p::sPolynomial47( Eigen::Matrix<double,48,85> & groebnerMatrix )
{
  groebnerMatrix(47,12) = groebnerMatrix(19,56)/(groebnerMatrix(19,55));
  groebnerMatrix(47,15) = -groebnerMatrix(29,56)/(groebnerMatrix(29,51));
  groebnerMatrix(47,28) = -groebnerMatrix(29,63)/(groebnerMatrix(29,51));
  groebnerMatrix(47,31) = -groebnerMatrix(29,67)/(groebnerMatrix(29,51));
  groebnerMatrix(47,42) = groebnerMatrix(19,75)/(groebnerMatrix(19,55));
  groebnerMatrix(47,46) = (groebnerMatrix(19,76)/(groebnerMatrix(19,55))-groebnerMatrix(29,72)/(groebnerMatrix(29,51)));
  groebnerMatrix(47,49) = -groebnerMatrix(29,75)/(groebnerMatrix(29,51));
  groebnerMatrix(47,50) = -groebnerMatrix(29,76)/(groebnerMatrix(29,51));
  groebnerMatrix(47,51) = groebnerMatrix(19,77)/(groebnerMatrix(19,55));
  groebnerMatrix(47,55) = -groebnerMatrix(29,77)/(groebnerMatrix(29,51));
  groebnerMatrix(47,63) = groebnerMatrix(19,81)/(groebnerMatrix(19,55));
  groebnerMatrix(47,67) = (groebnerMatrix(19,82)/(groebnerMatrix(19,55))-groebnerMatrix(29,78)/(groebnerMatrix(29,51)));
  groebnerMatrix(47,70) = -groebnerMatrix(29,81)/(groebnerMatrix(29,51));
  groebnerMatrix(47,71) = -groebnerMatrix(29,82)/(groebnerMatrix(29,51));
  groebnerMatrix(47,72) = groebnerMatrix(19,83)/(groebnerMatrix(19,55));
  groebnerMatrix(47,76) = -groebnerMatrix(29,83)/(groebnerMatrix(29,51));
  groebnerMatrix(47,78) = groebnerMatrix(19,84)/(groebnerMatrix(19,55));
  groebnerMatrix(47,82) = -groebnerMatrix(29,84)/(groebnerMatrix(29,51));
}